

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_export_raw
              (mbedtls_rsa_context *ctx,uchar *N,size_t N_len,uchar *P,size_t P_len,uchar *Q,
              size_t Q_len,uchar *D,size_t D_len,uchar *E,size_t E_len)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_cmp_int(&ctx->N,0);
  if ((((((iVar1 != 0) && (iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0), iVar1 != 0)) &&
        (iVar1 = mbedtls_mpi_cmp_int(&ctx->Q,0), iVar1 != 0)) &&
       ((iVar1 = mbedtls_mpi_cmp_int(&ctx->D,0), iVar1 != 0 &&
        (iVar1 = mbedtls_mpi_cmp_int(&ctx->E,0), iVar1 != 0)))) ||
      (iVar1 = -0x4080, (P == (uchar *)0x0 && Q == (uchar *)0x0) && D == (uchar *)0x0)) &&
     ((((N == (uchar *)0x0 || (iVar1 = mbedtls_mpi_write_binary(&ctx->N,N,N_len), iVar1 == 0)) &&
       ((P == (uchar *)0x0 || (iVar1 = mbedtls_mpi_write_binary(&ctx->P,P,P_len), iVar1 == 0)))) &&
      ((Q == (uchar *)0x0 || (iVar1 = mbedtls_mpi_write_binary(&ctx->Q,Q,Q_len), iVar1 == 0)))))) {
    if (D == (uchar *)0x0) {
      if (E != (uchar *)0x0) goto LAB_0187faec;
      iVar1 = 0;
    }
    else {
      iVar1 = mbedtls_mpi_write_binary(&ctx->D,D,D_len);
      if (E != (uchar *)0x0 && iVar1 == 0) {
LAB_0187faec:
        iVar1 = mbedtls_mpi_write_binary(&ctx->E,E,E_len);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_export_raw(const mbedtls_rsa_context *ctx,
                           unsigned char *N, size_t N_len,
                           unsigned char *P, size_t P_len,
                           unsigned char *Q, size_t Q_len,
                           unsigned char *D, size_t D_len,
                           unsigned char *E, size_t E_len)
{
    int ret = 0;
    int is_priv;

    /* Check if key is private or public */
    is_priv =
        mbedtls_mpi_cmp_int(&ctx->N, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->P, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->Q, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->D, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->E, 0) != 0;

    if (!is_priv) {
        /* If we're trying to export private parameters for a public key,
         * something must be wrong. */
        if (P != NULL || Q != NULL || D != NULL) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

    }

    if (N != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->N, N, N_len));
    }

    if (P != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->P, P, P_len));
    }

    if (Q != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->Q, Q, Q_len));
    }

    if (D != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->D, D, D_len));
    }

    if (E != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&ctx->E, E, E_len));
    }

cleanup:

    return ret;
}